

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O2

void __thiscall binpac::FlowBuffer::MarkOrCopyLine_CR_OR_LF(FlowBuffer *this)

{
  uint8 uVar1;
  const_byteptr puVar2;
  long lVar3;
  const_byteptr data;
  
  data = this->orig_data_begin_;
  if ((data != (const_byteptr)0x0) && (puVar2 = this->orig_data_end_, puVar2 != (const_byteptr)0x0))
  {
    if ((data < puVar2) && ((this->state_ == CR_OR_LF_1 && (*data == '\n')))) {
      this->state_ = CR_OR_LF_0;
      data = data + 1;
      this->orig_data_begin_ = data;
    }
    lVar3 = 0;
    while( true ) {
      if (puVar2 <= data + lVar3) {
        AppendToBuffer(this,data,(int)puVar2 - (int)data);
        return;
      }
      uVar1 = data[lVar3];
      if (uVar1 == '\n') break;
      if (uVar1 == '\r') {
        this->state_ = CR_OR_LF_1;
        break;
      }
      lVar3 = lVar3 + 1;
    }
    if (this->buffer_n_ == 0) {
      this->frame_length_ = (int)lVar3;
    }
    else {
      AppendToBuffer(this,data,(int)lVar3 + 1);
      this->buffer_n_ = this->buffer_n_ + -1;
    }
    this->message_complete_ = true;
  }
  return;
}

Assistant:

void FlowBuffer::MarkOrCopyLine_CR_OR_LF()
	{
	if ( ! (orig_data_begin_ && orig_data_end_) )
		return;

	if ( state_ == CR_OR_LF_1 && orig_data_begin_ < orig_data_end_ && *orig_data_begin_ == LF )
		{
		state_ = CR_OR_LF_0;
		++orig_data_begin_;
		}

	const_byteptr data;
	for ( data = orig_data_begin_; data < orig_data_end_; ++data )
		{
		switch ( *data )
			{
			case CR:
				state_ = CR_OR_LF_1;
				goto found_end_of_line;

			case LF:
				// state_ = CR_OR_LF_0;
				goto found_end_of_line;

			default:
				// state_ = CR_OR_LF_0;
				break;
			}
		}

	AppendToBuffer(orig_data_begin_, orig_data_end_ - orig_data_begin_);
	return;

found_end_of_line:
	if ( buffer_n_ == 0 )
		{
		frame_length_ = data - orig_data_begin_;
		}
	else
		{
		AppendToBuffer(orig_data_begin_, data + 1 - orig_data_begin_);
		// But eliminate the last CR or LF
		--buffer_n_;
		}
	message_complete_ = true;

#if DEBUG_FLOW_BUFFER
	fprintf(stderr, "%.6f Line complete: [%s]\n", network_time(),
	        string((const char*)begin(), (const char*)end()).c_str());
#endif
	}